

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
DensityCalculator<double,_float>::push_bdens_fast_route
          (DensityCalculator<double,_float> *this,double split_point,size_t col)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_28;
  double local_20;
  
  dVar1 = (this->box_high).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  dVar2 = (this->box_low).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  dVar3 = dVar1 - dVar2;
  dVar2 = (split_point - dVar2) / dVar3;
  dVar3 = (dVar1 - split_point) / dVar3;
  if (dVar2 <= 2.2250738585072014e-308) {
    dVar2 = 2.2250738585072014e-308;
  }
  if (0.9999999999999998 <= dVar2) {
    dVar2 = 0.9999999999999998;
  }
  local_20 = log(dVar2);
  dVar1 = (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  local_20 = local_20 + dVar1;
  if (dVar3 <= 2.2250738585072014e-308) {
    dVar3 = 2.2250738585072014e-308;
  }
  if (0.9999999999999998 <= dVar3) {
    dVar3 = 0.9999999999999998;
  }
  local_28 = log(dVar3);
  local_28 = local_28 + dVar1;
  std::vector<double,_std::allocator<double>_>::push_back(&this->multipliers,&local_28);
  std::vector<double,_std::allocator<double>_>::push_back(&this->multipliers,&local_20);
  push_bdens_internal(this,split_point,col);
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::push_bdens_fast_route(double split_point, size_t col)
{
    ldouble_safe curr_range = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
    ldouble_safe fraction_left  =  ((ldouble_safe)split_point - (ldouble_safe)this->box_low[col]) / curr_range;
    ldouble_safe fraction_right = ((ldouble_safe)this->box_high[col] - (ldouble_safe)split_point) / curr_range;
    fraction_left   = std::fmax(fraction_left, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_left   = std::fmin(fraction_left, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_left   = std::log(fraction_left);
    fraction_left  += this->multipliers.back();
    fraction_right  = std::fmax(fraction_right, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_right  = std::fmin(fraction_right, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_right  = std::log(fraction_right);
    fraction_right += this->multipliers.back();
    this->multipliers.push_back(fraction_right);
    this->multipliers.push_back(fraction_left);

    this->push_bdens_internal(split_point, col);
}